

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * dialogNameOnly(void)

{
  int iVar1;
  char *pcVar2;
  char *in_stack_00000818;
  
  if (dialogNameOnly::lDialogName[0] == '*') {
    if (tinyfd_allowCursesDialogs == 0) {
      strcpy(dialogNameOnly::lDialogName,"");
    }
    else {
      iVar1 = tfd_isDarwin();
      if ((((iVar1 == 0) ||
           (pcVar2 = strcpy(dialogNameOnly::lDialogName,"/opt/local/bin/dialog"), *pcVar2 == '\0'))
          || (iVar1 = detectPresence(in_stack_00000818), iVar1 == 0)) &&
         ((pcVar2 = strcpy(dialogNameOnly::lDialogName,"dialog"), *pcVar2 == '\0' ||
          (iVar1 = detectPresence(in_stack_00000818), iVar1 == 0)))) {
        strcpy(dialogNameOnly::lDialogName,"");
      }
    }
  }
  return dialogNameOnly::lDialogName;
}

Assistant:

static char * dialogNameOnly(void)
{
	static char lDialogName[128] = "*" ;
	if ( lDialogName[0] == '*' )
	{
		if (!tinyfd_allowCursesDialogs)
		{
			strcpy(lDialogName , "" );
		}
		else if ( tfd_isDarwin() && * strcpy(lDialogName , "/opt/local/bin/dialog" )
			&& detectPresence( lDialogName ) )
		{}
		else if ( * strcpy(lDialogName , "dialog" )
			&& detectPresence( lDialogName ) )
		{}
		else
		{
			strcpy(lDialogName , "" );
		}
	}
	return lDialogName ;
}